

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O2

void VP8LTransformColor_C(VP8LMultipliers *m,uint32_t *data,int num_pixels)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)num_pixels;
  if (num_pixels < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = data[uVar2];
    iVar4 = (int)(char)(uVar1 >> 8);
    data[uVar2] = ((uVar1 >> 0x10) - ((uint)((char)m->green_to_red_ * iVar4) >> 5) & 0xff) << 0x10 |
                  uVar1 & 0xff00ff00 |
                  uVar1 - (((uint)((int)(char)(uVar1 >> 0x10) * (int)(char)m->red_to_blue_) >> 5) +
                          ((uint)((char)m->green_to_blue_ * iVar4) >> 5)) & 0xff;
  }
  return;
}

Assistant:

void VP8LTransformColor_C(const VP8LMultipliers* const m, uint32_t* data,
                          int num_pixels) {
  int i;
  for (i = 0; i < num_pixels; ++i) {
    const uint32_t argb = data[i];
    const int8_t green = U32ToS8(argb >>  8);
    const int8_t red   = U32ToS8(argb >> 16);
    int new_red = red & 0xff;
    int new_blue = argb & 0xff;
    new_red -= ColorTransformDelta(m->green_to_red_, green);
    new_red &= 0xff;
    new_blue -= ColorTransformDelta(m->green_to_blue_, green);
    new_blue -= ColorTransformDelta(m->red_to_blue_, red);
    new_blue &= 0xff;
    data[i] = (argb & 0xff00ff00u) | (new_red << 16) | (new_blue);
  }
}